

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::IGXMLScanner::normalizeAttValue
          (IGXMLScanner *this,XMLAttDef *attDef,XMLCh *attName,XMLCh *value,XMLBuffer *toFill)

{
  XMLByte XVar1;
  XMLByte *pXVar2;
  bool bVar3;
  bool bVar4;
  AttTypes AVar5;
  XMLCh XVar6;
  bool bVar7;
  XMLCh *pXVar8;
  bool bVar9;
  
  bVar9 = true;
  if (attDef == (XMLAttDef *)0x0) {
    AVar5 = AttTypes_Min;
  }
  else {
    AVar5 = attDef->fType;
    if (attDef->fExternalAttribute == true) {
      bVar9 = (uint)(AVar5 + ~NmTokens) < 0xfffffff9;
    }
  }
  toFill->fIndex = 0;
  if (Notation < AVar5 || AVar5 == AttTypes_Min) {
    bVar4 = true;
    do {
      pXVar8 = value + 1;
      XVar6 = *value;
      if (((ushort)XVar6 - 9 < 2) || (XVar6 == L'\r')) {
        XVar6 = L' ';
        if (((this->super_XMLScanner).fStandalone == true) &&
           ((this->super_XMLScanner).fValidate == true && !bVar9)) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0
                     ,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else if (XVar6 == L'<') {
        bVar4 = false;
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        XVar6 = L'<';
      }
      else if (XVar6 == L'\xffff') {
        XVar6 = value[1];
        pXVar8 = value + 2;
      }
      else if (XVar6 == L'\0') {
        return bVar4;
      }
      XMLBuffer::append(toFill,XVar6);
      value = pXVar8;
    } while( true );
  }
  bVar4 = true;
  bVar3 = false;
  do {
    bVar7 = false;
    while( true ) {
      while( true ) {
        XVar6 = *value;
        if (XVar6 == L'<') {
          bVar4 = false;
          XMLScanner::emitError
                    (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          XVar6 = L'<';
        }
        else if (XVar6 == L'\xffff') {
          XVar6 = value[1];
          value = value + 1;
        }
        else if (XVar6 == L'\0') {
          return bVar4;
        }
        pXVar2 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable;
        XVar1 = pXVar2[(ushort)XVar6];
        if (bVar7) break;
        if (-1 < (char)XVar1) goto LAB_002ac096;
        value = value + 1;
        bVar7 = true;
        if ((((this->super_XMLScanner).fStandalone == true) &&
            ((this->super_XMLScanner).fValidate == true && !bVar9)) &&
           ((!bVar3 ||
            (((XVar6 != L' ' && ((ulong)(ushort)*value != 0)) &&
             ((char)pXVar2[(ushort)*value] < '\0')))))) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0
                     ,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      if (-1 < (char)XVar1) break;
      value = value + 1;
      bVar7 = true;
    }
    if (bVar3) {
      XMLBuffer::append(toFill,L' ');
    }
LAB_002ac096:
    XMLBuffer::append(toFill,XVar6);
    value = value + 1;
    bVar3 = true;
  } while( true );
}

Assistant:

bool IGXMLScanner::normalizeAttValue( const   XMLAttDef* const    attDef
                                      , const XMLCh* const        attName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // A simple state value for a whitespace processing state machine
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)?attDef->getType():XMLAttDef::CData;

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    XMLCh nextCh;
    const XMLCh* srcPtr = value;

    if (type == XMLAttDef::CData || type > XMLAttDef::Notation) {
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        while ((nextCh = *srcPtr++)!=0)
        {
            switch(nextCh)
            {
            // Do we have an escaped character ?
            case 0xFFFF:
                nextCh = *srcPtr++;
                break;
            case 0x09:
            case 0x0A:
            case 0x0D:
                // Check Validity Constraint for Standalone document declaration
                // XML 1.0, Section 2.9
                if (fStandalone && fValidate && isAttTokenizedExternal)
                {
                     // Can't have a standalone document declaration of "yes" if  attribute
                     // values are subject to normalisation
                     fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                }
                nextCh = chSpace;
                break;
            case chOpenAngle:
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
                break;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);
        }
    }
    else {
        States curState = InContent;
        bool firstNonWS = false;
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        while ((nextCh = *srcPtr)!=0)
        {
            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            if (curState == InWhitespace)
            {
                if (!fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    if (firstNonWS)
                        toFill.append(chSpace);
                    curState = InContent;
                    firstNonWS = true;
                }
                else
                {
                    srcPtr++;
                    continue;
                }
            }
            else if (curState == InContent)
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    curState = InWhitespace;
                    srcPtr++;

                    // Check Validity Constraint for Standalone document declaration
                    // XML 1.0, Section 2.9
                    if (fStandalone && fValidate && isAttTokenizedExternal)
                    {
                        if (!firstNonWS || (nextCh != chSpace && *srcPtr && fReaderMgr.getCurrentReader()->isWhitespace(*srcPtr)))
                        {
                            // Can't have a standalone document declaration of "yes" if  attribute
                            // values are subject to normalisation
                            fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                        }
                    }
                    continue;
                }
                firstNonWS = true;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }

    return retVal;
}